

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_sudoku.cpp
# Opt level: O0

void __thiscall TrainSudoku::addDependencies(TrainSudoku *this)

{
  initializer_list<std::pair<int,_int>_> __l;
  initializer_list<std::pair<int,_int>_> __l_00;
  initializer_list<std::pair<int,_int>_> __l_01;
  initializer_list<std::pair<int,_int>_> __l_02;
  initializer_list<std::pair<int,_int>_> __l_03;
  initializer_list<std::pair<int,_int>_> __l_04;
  ostream *poVar1;
  allocator<std::pair<int,_int>_> local_30a;
  less<std::pair<int,_int>_> local_309;
  int local_308 [8];
  pair<int,_int> local_2e8;
  pair<int,_int> local_2e0;
  pair<int,_int> local_2d8;
  pair<int,_int> local_2d0;
  iterator local_2c8;
  size_type local_2c0;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_2b8;
  allocator<std::pair<int,_int>_> local_282;
  less<std::pair<int,_int>_> local_281;
  int local_280 [8];
  pair<int,_int> local_260;
  pair<int,_int> local_258;
  pair<int,_int> local_250;
  pair<int,_int> local_248;
  pair<int,_int> *local_240;
  size_type local_238;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_230;
  allocator<std::pair<int,_int>_> local_1fa;
  less<std::pair<int,_int>_> local_1f9;
  int local_1f8 [6];
  pair<int,_int> local_1e0;
  pair<int,_int> local_1d8;
  pair<int,_int> local_1d0;
  iterator local_1c8;
  size_type local_1c0;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_1b8;
  allocator<std::pair<int,_int>_> local_182;
  less<std::pair<int,_int>_> local_181;
  int local_180 [6];
  pair<int,_int> local_168;
  pair<int,_int> local_160;
  pair<int,_int> local_158;
  pair<int,_int> *local_150;
  size_type local_148;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_140;
  allocator<std::pair<int,_int>_> local_10a;
  less<std::pair<int,_int>_> local_109;
  int local_108 [6];
  pair<int,_int> local_f0;
  pair<int,_int> local_e8;
  pair<int,_int> local_e0;
  iterator local_d8;
  size_type local_d0;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_c8;
  allocator<std::pair<int,_int>_> local_82;
  less<std::pair<int,_int>_> local_81;
  int local_80 [6];
  pair<int,_int> local_68;
  pair<int,_int> local_60;
  pair<int,_int> local_58;
  pair<int,_int> *local_50;
  size_type local_48;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_40;
  TrainSudoku *local_10;
  TrainSudoku *this_local;
  
  local_10 = this;
  Sudoku::addDependencies(&this->super_Sudoku);
  poVar1 = std::operator<<((ostream *)&std::cout,"Add group dependencies");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_80[5] = 3;
  local_80[4] = 1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_68,local_80 + 5,local_80 + 4);
  local_80[3] = 4;
  local_80[2] = 1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_60,local_80 + 3,local_80 + 2);
  local_80[1] = 5;
  local_80[0] = 1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_58,local_80 + 1,local_80);
  local_48 = 3;
  local_50 = &local_68;
  std::allocator<std::pair<int,_int>_>::allocator(&local_82);
  __l_04._M_len = local_48;
  __l_04._M_array = local_50;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set(&local_40,__l_04,&local_81,&local_82);
  local_108[5] = 0;
  local_108[4] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_f0,local_108 + 5,local_108 + 4);
  local_108[3] = 1;
  local_108[2] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_e8,local_108 + 3,local_108 + 2);
  local_108[1] = 2;
  local_108[0] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_e0,local_108 + 1,local_108);
  local_d8 = &local_f0;
  local_d0 = 3;
  std::allocator<std::pair<int,_int>_>::allocator(&local_10a);
  __l_03._M_len = local_d0;
  __l_03._M_array = local_d8;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set(&local_c8,__l_03,&local_109,&local_10a);
  addTrainDependencies(this,&local_40,&local_c8);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set(&local_c8);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_10a);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set(&local_40);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_82);
  local_180[5] = 6;
  local_180[4] = 1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_168,local_180 + 5,local_180 + 4);
  local_180[3] = 7;
  local_180[2] = 1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_160,local_180 + 3,local_180 + 2);
  local_180[1] = 8;
  local_180[0] = 1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_158,local_180 + 1,local_180);
  local_148 = 3;
  local_150 = &local_168;
  std::allocator<std::pair<int,_int>_>::allocator(&local_182);
  __l_02._M_len = local_148;
  __l_02._M_array = local_150;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set(&local_140,__l_02,&local_181,&local_182);
  local_1f8[5] = 3;
  local_1f8[4] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_1e0,local_1f8 + 5,local_1f8 + 4);
  local_1f8[3] = 4;
  local_1f8[2] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_1d8,local_1f8 + 3,local_1f8 + 2);
  local_1f8[1] = 5;
  local_1f8[0] = 3;
  std::pair<int,_int>::pair<int,_int,_true>(&local_1d0,local_1f8 + 1,local_1f8);
  local_1c8 = &local_1e0;
  local_1c0 = 3;
  std::allocator<std::pair<int,_int>_>::allocator(&local_1fa);
  __l_01._M_len = local_1c0;
  __l_01._M_array = local_1c8;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set(&local_1b8,__l_01,&local_1f9,&local_1fa);
  addTrainDependencies(this,&local_140,&local_1b8);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set(&local_1b8);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_1fa);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set(&local_140);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_182);
  local_280[7] = 5;
  local_280[6] = 5;
  std::pair<int,_int>::pair<int,_int,_true>(&local_260,local_280 + 7,local_280 + 6);
  local_280[5] = 6;
  local_280[4] = 5;
  std::pair<int,_int>::pair<int,_int,_true>(&local_258,local_280 + 5,local_280 + 4);
  local_280[3] = 7;
  local_280[2] = 5;
  std::pair<int,_int>::pair<int,_int,_true>(&local_250,local_280 + 3,local_280 + 2);
  local_280[1] = 8;
  local_280[0] = 5;
  std::pair<int,_int>::pair<int,_int,_true>(&local_248,local_280 + 1,local_280);
  local_238 = 4;
  local_240 = &local_260;
  std::allocator<std::pair<int,_int>_>::allocator(&local_282);
  __l_00._M_len = local_238;
  __l_00._M_array = local_240;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set(&local_230,__l_00,&local_281,&local_282);
  local_308[7] = 2;
  local_308[6] = 7;
  std::pair<int,_int>::pair<int,_int,_true>(&local_2e8,local_308 + 7,local_308 + 6);
  local_308[5] = 3;
  local_308[4] = 7;
  std::pair<int,_int>::pair<int,_int,_true>(&local_2e0,local_308 + 5,local_308 + 4);
  local_308[3] = 4;
  local_308[2] = 7;
  std::pair<int,_int>::pair<int,_int,_true>(&local_2d8,local_308 + 3,local_308 + 2);
  local_308[1] = 5;
  local_308[0] = 7;
  std::pair<int,_int>::pair<int,_int,_true>(&local_2d0,local_308 + 1,local_308);
  local_2c8 = &local_2e8;
  local_2c0 = 4;
  std::allocator<std::pair<int,_int>_>::allocator(&local_30a);
  __l._M_len = local_2c0;
  __l._M_array = local_2c8;
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set(&local_2b8,__l,&local_309,&local_30a);
  addTrainDependencies(this,&local_230,&local_2b8);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set(&local_2b8);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_30a);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set(&local_230);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_282);
  poVar1 = std::operator<<((ostream *)&std::cout,"done");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TrainSudoku::addDependencies()
{
  Sudoku::addDependencies();
  
  std::cout<<"Add group dependencies"<<std::endl;

  // add group dependencies
  // Each row is one train (x,y) coordinates. The trains consist of the same numbers.
  
#if 0
  // 2
  addTrainDependencies(
    {{0, 0}, {1, 0}, {2, 0}},
    {{2, 4}, {3, 4}, {4, 4}}
  );

  // 3
  addTrainDependencies(
    {{3, 0}, {4, 0}, {5, 0}},
    {{5, 4}, {6, 4}, {7, 4}}
  );

  // 4
  addTrainDependencies(
    {{5, 2}, {6, 2}, {7, 2}, {8, 2}},
    {{1, 8}, {2, 8}, {3, 8}, {4, 8}}
  );


  // 5
  addTrainDependencies(
    {{0, 3}, {1, 3}, {2, 3}, {3, 3}},
    {{1, 6}, {2, 6}, {3, 6}, {4, 6}}
  );

#else
  // 2
  addTrainDependencies(
    {{3, 1}, {4, 1}, {5, 1}},
    {{0, 3}, {1, 3}, {2, 3}}
  );

  // 3
  addTrainDependencies(
    {{6, 1}, {7, 1}, {8, 1}},
    {{3, 3}, {4, 3}, {5, 3}}
  );

  // 4
  addTrainDependencies(
    {{5, 5}, {6, 5}, {7, 5}, {8, 5}},
    {{2, 7}, {3, 7}, {4, 7}, {5, 7}}
  );


if (false)
{

  // 5
  addTrainDependencies(
    {{1, 6}, {2, 6}, {3, 6}},
    {{2, 8}, {3, 8}, {4, 8}}
  );
}

#endif

  std::cout<<"done"<<std::endl;
}